

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::FILE_NOT_FOUND(string *filename,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[17],std::__cxx11::string_const&>
            (&local_30,(char (*) [17])"File not found: ",filename);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FILE_NOT_FOUND(const std::string& filename, cmJSONState* state)
{
  state->AddError(cmStrCat("File not found: ", filename));
}